

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

const_reference __thiscall
OpenMesh::BaseKernel::property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,VPropHandleT<OpenMesh::Attributes::StatusInfo> _ph,VertexHandle _vh)

{
  int _idx;
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_00;
  const_reference pvVar1;
  BaseKernel *this_local;
  VertexHandle _vh_local;
  VPropHandleT<OpenMesh::Attributes::StatusInfo> _ph_local;
  
  this_local._0_4_ = _vh.super_BaseHandle.idx_;
  this_local._4_4_ =
       (int)_ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
  this_00 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                      (&this->vprops_,
                       _ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                       idx_);
  _idx = BaseHandle::idx((BaseHandle *)&this_local);
  pvVar1 = PropertyT<OpenMesh::Attributes::StatusInfo>::operator[](this_00,_idx);
  return pvVar1;
}

Assistant:

typename VPropHandleT<T>::const_reference
  property(VPropHandleT<T> _ph, VertexHandle _vh) const {
    return vprops_.property(_ph)[_vh.idx()];
  }